

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

String * File::getAbsolutePath(String *__return_storage_ptr__,String *path)

{
  bool bVar1;
  usize uVar2;
  usize uVar3;
  String *path_local;
  String *result;
  
  bVar1 = isAbsolutePath(path);
  if (bVar1) {
    String::String(__return_storage_ptr__,path);
  }
  else {
    Directory::getCurrentDirectory();
    uVar2 = String::length(__return_storage_ptr__);
    uVar3 = String::length(path);
    String::reserve(__return_storage_ptr__,uVar2 + 1 + uVar3);
    String::append(__return_storage_ptr__,'/');
    String::append(__return_storage_ptr__,path);
  }
  return __return_storage_ptr__;
}

Assistant:

String File::getAbsolutePath(const String& path)
{
  if(isAbsolutePath(path))
    return path;
  String result = Directory::getCurrentDirectory();
  result.reserve(result.length() + 1 + path.length());
  result.append('/');
  result.append(path);
  return result;
}